

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

double Abc_SccEnumCost(Abc_TgMan_t *pMan,Abc_SccCost_t c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  iVar2 = c.cPerm;
  iVar1 = pMan->nAlgorithm;
  iVar3 = c.cPhase;
  if (iVar1 == 2) {
    return (double)iVar2 * 0.00855 + (double)pMan->nVars * 0.94 + (double)iVar3 * 0.885 + -20.59;
  }
  if (iVar1 == 1) {
    dVar5 = (double)iVar3 * 0.855 + (double)pMan->nVars;
    dVar4 = (double)iVar2 * 0.00797;
  }
  else {
    if (iVar1 != 0) {
      return 0.0;
    }
    dVar5 = (double)iVar3 * 1.09 + (double)pMan->nVars;
    dVar4 = (double)iVar2 * 0.01144;
  }
  return dVar4 + dVar5;
}

Assistant:

static inline double Abc_SccEnumCost(Abc_TgMan_t * pMan, Abc_SccCost_t c)
{
    switch (pMan->nAlgorithm)
    {
        case 0: return pMan->nVars + c.cPhase * 1.09 + c.cPerm * 0.01144;
        case 1: return pMan->nVars + c.cPhase * 0.855 + c.cPerm * 0.00797;
        case 2: return pMan->nVars * 0.94 + c.cPhase * 0.885 + c.cPerm * 0.00855 - 20.59;
    }
    return 0;
}